

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::begin_record
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  pointer pcVar1;
  long lVar2;
  
  this->offset_ = 0;
  pcVar1 = (this->stack_).
           super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pcVar1[-1] == header) && (this->header_line_offset_ + this->header_lines_ < this->line_)) {
    pcVar1[-1] = data;
  }
  if (pcVar1[-1] == data) {
    if (this->mapping_kind_ == n_rows) {
      lVar2 = 0x30;
    }
    else {
      if (this->mapping_kind_ != n_objects) {
        return;
      }
      lVar2 = 0x18;
    }
  }
  else {
    if (pcVar1[-1] != header) {
      return;
    }
    if (this->mapping_kind_ != n_rows) {
      return;
    }
    if (this->assume_header_ != true) {
      return;
    }
    lVar2 = 0x30;
    if (this->line_ != this->header_line_offset_ + this->header_line_) {
      return;
    }
  }
  (**(code **)((long)visitor->_vptr_basic_json_visitor + lVar2))(visitor,0,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  this->level_ = this->level_ + 1;
  return;
}

Assistant:

void begin_record(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        offset_ = 0;

        if (stack_.back() == csv_mode::header && line_ > (header_lines_+header_line_offset_))
        {
            stack_.back() = csv_mode::data;
        }
        switch (stack_.back())
        {
            case csv_mode::header:
                switch (mapping_kind_)
                {
                    case csv_mapping_kind::n_rows:
                        if (assume_header_ && line_ == (header_line_+header_line_offset_))
                        {
                            visitor.begin_array(semantic_tag::none, *this, ec);
                            more_ = !cursor_mode_;
                            ++level_;
                        }
                        break;
                    default:
                        break;
                }
                break;
            case csv_mode::data:
                switch (mapping_kind_)
                {
                    case csv_mapping_kind::n_rows:
                        visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                        break;
                    case csv_mapping_kind::n_objects:
                        visitor.begin_object(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                        break;
                    case csv_mapping_kind::m_columns:
                        break;
                    default:
                        break;
                }
                break;
            default:
                break;
        }
    }